

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_send_multiple_jobs_with_failures(void)

{
  ulong uVar1;
  bool bVar2;
  cio_buffered_stream *pcVar3;
  cio_buffered_stream_write_handler_t p_Var4;
  void *pvVar5;
  _Bool _Var6;
  cio_error cVar7;
  ulong uVar8;
  _Bool status_code_required;
  cio_write_buffer *pcVar9;
  size_t sVar10;
  write_func write_funcs [3];
  cio_write_buffer wb;
  cio_write_buffer text_wbh;
  cio_write_buffer pong_wbh;
  cio_write_buffer ping_wbh;
  char buffer [125];
  _func_cio_error_cio_buffered_stream_ptr_cio_write_buffer_ptr_cio_buffered_stream_write_handler_t_void_ptr
  *local_158;
  code *pcStack_150;
  code *local_148;
  cio_write_buffer local_138;
  cio_write_buffer local_118;
  cio_write_buffer local_f8;
  cio_write_buffer local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined5 uStack_50;
  undefined3 local_4b;
  undefined5 uStack_48;
  undefined8 uStack_43;
  
  local_138.data.head.q_len = (size_t)&local_b8;
  uStack_b0 = 0;
  uStack_48 = 0;
  uStack_43 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_4b = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0x61;
  cio_buffered_stream_write_fake.custom_fake_seq = &local_158;
  local_148 = bs_write_ok;
  local_158 = bs_write_later;
  pcStack_150 = bs_write_error;
  cio_buffered_stream_write_fake.custom_fake_seq_len = 3;
  local_d8.next = &local_d8;
  local_d8.data.head.q_len = 0;
  local_d8.data.element.length = 0;
  local_f8.data.head.q_len = 0;
  local_f8.data.element.length = 0;
  local_118.next = &local_138;
  local_138.data.element.length = 0x7d;
  local_118.data.head.q_len = 1;
  local_118.data.element.length = 0x7d;
  local_138.next = &local_118;
  local_138.prev = &local_118;
  local_118.prev = local_118.next;
  local_f8.next = &local_f8;
  local_f8.prev = &local_f8;
  local_d8.prev = local_d8.next;
  cVar7 = cio_websocket_write_ping(ws,local_d8.next,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar7,"Writing a ping frame did not succeed!",0x3a8,UNITY_DISPLAY_STYLE_INT);
  cVar7 = cio_websocket_write_pong(ws,&local_f8,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar7,"Writing a pong frame did not succeed!",0x3aa,UNITY_DISPLAY_STYLE_INT);
  uVar8 = 1;
  cVar7 = cio_websocket_write_message_first_chunk
                    (ws,local_118.data.element.length,&local_118,true,false,write_handler,
                     (void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar7,"Writing a text frame did not succeed!",0x3ac,UNITY_DISPLAY_STYLE_INT);
  cVar7 = cio_websocket_close(ws,CIO_WEBSOCKET_CLOSE_NORMAL,(char *)0x0,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar7,"Writing a close frame did not succeed!",0x3ae,UNITY_DISPLAY_STYLE_INT);
  pvVar5 = write_later_handler_context;
  p_Var4 = write_later_handler;
  pcVar3 = write_later_bs;
  cio_buffered_stream_write_fake.custom_fake = bs_write_error;
  uVar1 = (write_later_buf->data).head.q_len;
  pcVar9 = write_later_buf;
  sVar10 = write_buffer_pos;
  if (uVar1 != 0) {
    do {
      pcVar9 = pcVar9->next;
      memcpy(write_buffer + sVar10,(pcVar9->data).element.field_0.const_data,
             (pcVar9->data).element.length);
      sVar10 = sVar10 + (pcVar9->data).element.length;
      bVar2 = uVar8 < uVar1;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar2);
  }
  write_buffer_pos = sVar10;
  (*p_Var4)(pcVar3,pvVar5,CIO_SUCCESS);
  UnityAssertEqualNumber
            (4,(ulong)write_handler_fake.call_count,"Write handler was not called",0x3b4,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[0],
             "websocket parameter of write_handler not correct",0x3b5,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[0] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0x3b6);
  }
  UnityAssertEqualNumber
            (0,(long)write_handler_fake.arg2_history[0],"err parameter of write_handler not correct"
             ,0x3b7,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[1],
             "websocket parameter of write_handler not correct",0x3b8,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[1] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0x3b9);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[1],
             "err parameter of write_handler not correct",0x3ba,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[2],
             "websocket parameter of write_handler not correct",0x3bb,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[2] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0x3bc);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[2],
             "err parameter of write_handler not correct",0x3bd,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[3],
             "websocket parameter of write_handler not correct",0x3be,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[3] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0x3bf);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[3],
             "err parameter of write_handler not correct",0x3c0,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)on_error_fake.call_count,"error callback was called",0x3c2,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
             "ws parameter in first fragment of error callback not correct",0x3c3,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (-0x5a,(long)on_error_fake.arg1_val,"error parameter in error callback not correct",
             0x3c4,UNITY_DISPLAY_STYLE_INT);
  status_code_required = false;
  _Var6 = check_frame(CIO_WEBSOCKET_PING_FRAME,(char *)0x0,0,true);
  if (!_Var6) {
    UnityFail("Written ping frame not correct",0x3c6);
  }
  _Var6 = is_close_frame(0x3f3,status_code_required);
  if (!_Var6) {
    UnityFail("Written close frame not correct",0x3c7);
  }
  return;
}

Assistant:

static void test_send_multiple_jobs_with_failures(void)
{
	char buffer[125] = {'a'};

	typedef enum cio_error (*write_func)(struct cio_buffered_stream *buffered_stream, struct cio_write_buffer *buffer, cio_buffered_stream_write_handler_t handler, void *handler_context);
	write_func write_funcs[3] = {bs_write_later, bs_write_error, bs_write_ok};

	cio_buffered_stream_write_fake.custom_fake_seq = write_funcs;
	cio_buffered_stream_write_fake.custom_fake_seq_len = ARRAY_SIZE(write_funcs);

	struct cio_write_buffer ping_wbh;
	cio_write_buffer_head_init(&ping_wbh);
	struct cio_write_buffer pong_wbh;
	cio_write_buffer_head_init(&pong_wbh);
	struct cio_write_buffer text_wbh;
	cio_write_buffer_head_init(&text_wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, buffer, sizeof(buffer));
	cio_write_buffer_queue_tail(&text_wbh, &wb);

	enum cio_error err = cio_websocket_write_ping(ws, &ping_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a ping frame did not succeed!");
	err = cio_websocket_write_pong(ws, &pong_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a pong frame did not succeed!");
	err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&text_wbh), &text_wbh, true, false, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a text frame did not succeed!");
	err = cio_websocket_close(ws, CIO_WEBSOCKET_CLOSE_NORMAL, NULL, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a close frame did not succeed!");

	// Simulate write call over the eventloop
	cio_buffered_stream_write_fake.custom_fake = bs_write_error;
	bs_write_ok(write_later_bs, write_later_buf, write_later_handler, write_later_handler_context);

	TEST_ASSERT_EQUAL_MESSAGE(4, write_handler_fake.call_count, "Write handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[0], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[0], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_history[0], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[1], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[1], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[1], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[2], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[2], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[2], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[3], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[3], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[3], "err parameter of write_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "ws parameter in first fragment of error callback not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_MESSAGE_TOO_LONG, on_error_fake.arg1_val, "error parameter in error callback not correct");

	TEST_ASSERT_TRUE_MESSAGE(check_frame(CIO_WEBSOCKET_PING_FRAME, NULL, 0, true), "Written ping frame not correct");
	TEST_ASSERT_TRUE_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, true), "Written close frame not correct");
}